

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs-libc.c
# Opt level: O3

JSValue js_os_dup2(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  int iVar1;
  uint uVar2;
  JSValueUnion JVar3;
  int *piVar4;
  int64_t iVar5;
  JSValue JVar6;
  int fd2;
  int fd;
  int local_20;
  int local_1c;
  
  iVar1 = JS_ToInt32(ctx,&local_1c,*argv);
  iVar5 = 6;
  if (iVar1 == 0) {
    iVar1 = JS_ToInt32(ctx,&local_20,argv[1]);
    if (iVar1 == 0) {
      uVar2 = dup2(local_1c,local_20);
      if (uVar2 == 0xffffffff) {
        piVar4 = __errno_location();
        uVar2 = -*piVar4;
      }
      JVar3._4_4_ = 0;
      JVar3.int32 = uVar2;
      iVar5 = 0;
      goto LAB_001145ba;
    }
  }
  JVar3.float64 = 0.0;
LAB_001145ba:
  JVar6.tag = iVar5;
  JVar6.u.float64 = JVar3.float64;
  return JVar6;
}

Assistant:

static JSValue js_os_dup2(JSContext *ctx, JSValueConst this_val,
                         int argc, JSValueConst *argv)
{
    int fd, fd2, ret;
    
    if (JS_ToInt32(ctx, &fd, argv[0]))
        return JS_EXCEPTION;
    if (JS_ToInt32(ctx, &fd2, argv[1]))
        return JS_EXCEPTION;
    ret = js_get_errno(dup2(fd, fd2));
    return JS_NewInt32(ctx, ret);
}